

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_> *this,void **vtt,
          TPZGeoMesh *DestMesh,TPZGeoElRefPattern<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_> *cp)

{
  TPZVec<long> *in_RSI;
  TPZVec<long> *in_RDI;
  TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_> *in_stack_00000018;
  TPZGeoMesh *in_stack_00000020;
  void **in_stack_00000028;
  TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_> *in_stack_00000030;
  TPZAutoPointer<TPZRefPattern> *in_stack_ffffffffffffffa8;
  
  TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_>::TPZGeoElRefLess
            (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018);
  in_RDI->_vptr_TPZVec = in_RSI->_vptr_TPZVec;
  *(long **)((long)&in_RDI->_vptr_TPZVec + (long)in_RDI->_vptr_TPZVec[-0xc]) = in_RSI[1].fStore;
  TPZVec<long>::TPZVec((TPZVec<long> *)&in_RDI[0xef].fNAlloc);
  TPZAutoPointer<TPZRefPattern>::TPZAutoPointer
            ((TPZAutoPointer<TPZRefPattern> *)&in_RDI[0xf0].fNAlloc,in_stack_ffffffffffffffa8);
  TPZVec<long>::operator=(in_RDI,in_RSI);
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern(TPZGeoMesh &DestMesh, const TPZGeoElRefPattern<TGeo> &cp):
TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),TPZGeoElRefLess<TGeo>(DestMesh,cp),
fRefPattern(cp.fRefPattern) {

	this->fSubEl = cp.fSubEl;
}